

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defineCallOpen.hh
# Opt level: O2

shared_ptr<discordpp::BotStruct::Call> __thiscall
discordpp::BotStruct::Call::shared_from_base<discordpp::BotStruct::Call>(Call *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<discordpp::BotStruct::Call> sVar1;
  __shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<discordpp::BotStruct::Call,void>
            (local_20,(__weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2> *)
                      (in_RSI + 8));
  std::static_pointer_cast<discordpp::BotStruct::Call,discordpp::BotStruct::Call>
            ((shared_ptr<discordpp::BotStruct::Call> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<discordpp::BotStruct::Call>)
         sVar1.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Derived> shared_from_base() {
        return std::static_pointer_cast<Derived>(shared_from_this());
    }